

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesBody(google::
protobuf::io::Printer*,bool)::LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__
          (void *this,FieldDescriptor *field)

{
  long lVar1;
  Printer *this_00;
  bool bVar2;
  OneofDescriptor *pOVar3;
  FieldOptions *this_01;
  char *pcVar4;
  reference pvVar5;
  int iVar6;
  int __c;
  string local_40;
  uint local_20;
  int local_1c;
  int new_index;
  int has_bit_index;
  FieldDescriptor *field_local;
  LazySerializerEmitter *this_local;
  
  _new_index = field;
  field_local = (FieldDescriptor *)this;
  if (((*(byte *)((long)this + 0x11) & 1) != 0) ||
     (bVar2 = MustFlush(google::protobuf::FieldDescriptor_const__(this,field), bVar2)) {
    GenerateSerializeWithCachedSizesBody::LazySerializerEmitter::Flush
              ((LazySerializerEmitter *)this);
  }
  pOVar3 = FieldDescriptor::containing_oneof(_new_index);
  if (pOVar3 == (OneofDescriptor *)0x0) {
    this_01 = FieldDescriptor::options(_new_index);
    bVar2 = FieldOptions::weak(this_01);
    if (((!bVar2) && (bVar2 = FieldDescriptor::is_repeated(_new_index), !bVar2)) &&
       ((*(byte *)((long)this + 0x11) & 1) == 0)) {
      lVar1 = *this;
      pcVar4 = FieldDescriptor::index(_new_index,(char *)field,__c);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(lVar1 + 0xc0),(long)(int)pcVar4);
      local_1c = *pvVar5;
      if (*(int *)((long)this + 0x30) != local_1c / 0x20) {
        iVar6 = local_1c;
        if (local_1c < 0) {
          iVar6 = local_1c + 0x1f;
        }
        local_20 = iVar6 >> 5;
        this_00 = *(Printer **)((long)this + 8);
        SimpleItoa_abi_cxx11_(&local_40,(protobuf *)(ulong)local_20,local_1c + 0x1f);
        protobuf::io::Printer::Print
                  (this_00,"cached_has_bits = _has_bits_[$new_index$];\n","new_index",&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        *(uint *)((long)this + 0x30) = local_20;
      }
    }
    GenerateSerializeOneField
              (*this,*(Printer **)((long)this + 8),_new_index,
               (bool)(*(byte *)((long)this + 0x10) & 1),*(int *)((long)this + 0x30));
  }
  else {
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)((long)this + 0x18),(value_type *)&new_index);
  }
  return;
}

Assistant:

void Emit(const FieldDescriptor* field) {
      if (eager_ || MustFlush(field)) {
        Flush();
      }
      if (field->containing_oneof() == NULL) {
        // TODO(ckennelly): Defer non-oneof fields similarly to oneof fields.

        if (!field->options().weak() && !field->is_repeated() && !eager_) {
          // We speculatively load the entire _has_bits_[index] contents, even
          // if it is for only one field.  Deferring non-oneof emitting would
          // allow us to determine whether this is going to be useful.
          int has_bit_index = mg_->has_bit_indices_[field->index()];
          if (cached_has_bit_index_ != has_bit_index / 32) {
            // Reload.
            int new_index = has_bit_index / 32;

            printer_->Print(
                "cached_has_bits = _has_bits_[$new_index$];\n",
                "new_index", SimpleItoa(new_index));

            cached_has_bit_index_ = new_index;
          }
        }

        mg_->GenerateSerializeOneField(
            printer_, field, to_array_, cached_has_bit_index_);
      } else {
        v_.push_back(field);
      }
    }